

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

UBool icu_63::GMTOffsetField::isValid(FieldType type,int32_t width)

{
  if ((type != SECOND) && (type != MINUTE)) {
    if (type == HOUR) {
      return width - 1U < 2;
    }
    return 0 < width;
  }
  return width == 2;
}

Assistant:

UBool
GMTOffsetField::isValid(FieldType type, int32_t width) {
    switch (type) {
    case HOUR:
        return (width == 1 || width == 2);
    case MINUTE:
    case SECOND:
        return (width == 2);
    default:
        U_ASSERT(FALSE);
    }
    return (width > 0);
}